

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionEquipmentResource,_0UL>
         ::Construct(DB *db,LIST *params)

{
  IfcConstructionResource *this;
  
  this = (IfcConstructionResource *)operator_new(0x1a0);
  *(undefined ***)&this->field_0x188 = &PTR__Object_008f50b0;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcConstructionEquipmentResource";
  Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
            (this,&PTR_construction_vtable_24__0098b850);
  *(undefined ***)this = &PTR__IfcConstructionEquipmentResource_0098b748;
  *(undefined ***)&this->field_0x188 = &PTR__IfcConstructionEquipmentResource_0098b838;
  *(undefined ***)&this->field_0x88 = &PTR__IfcConstructionEquipmentResource_0098b770;
  *(undefined ***)&this->field_0x98 = &PTR__IfcConstructionEquipmentResource_0098b798;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcConstructionEquipmentResource_0098b7c0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcConstructionEquipmentResource_0098b7e8;
  *(undefined ***)&this->field_0x178 = &PTR__IfcConstructionEquipmentResource_0098b810;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConstructionEquipmentResource>
            (db,params,(IfcConstructionEquipmentResource *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }